

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.h
# Opt level: O1

void __thiscall
OrderMoney::OrderMoney<>
          (OrderMoney *this,shared_ptr<const_Money> *a,shared_ptr<const_Money> *b,
          shared_ptr<const_Money> *c)

{
  undefined1 local_39;
  OrderMoney *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<const_Money> local_28;
  
  local_38 = (OrderMoney *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OrderMoney,std::allocator<OrderMoney>,std::shared_ptr<Money_const>const&,std::shared_ptr<Money_const>const&>
            (&_Stack_30,&local_38,(allocator<OrderMoney> *)&local_39,a,b);
  local_28.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_Money;
  local_28.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_30._M_pi;
  local_38 = (OrderMoney *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  OrderMoney(this,&local_28,c);
  if (local_28.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

OrderMoney(
		const std::shared_ptr<const Money> &a,
		const std::shared_ptr<const Money> &b,
		const std::shared_ptr<const Money> &c,
		const T & ...d
	) : OrderMoney(std::make_shared<OrderMoney>(a, b), c, d...)
	{
	}